

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O3

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* str::split(vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *__return_storage_ptr__,string_view str,string_view delimiter)

{
  pointer *ppbVar1;
  iterator iVar2;
  pointer pbVar3;
  size_type sVar4;
  undefined8 uVar5;
  size_type __n;
  ulong __pos;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  string_view str_local;
  
  __n = delimiter._M_len;
  str_local._M_len = (size_t)str._M_str;
  local_40 = (undefined1  [8])str._M_len;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_40 == (undefined1  [8])0x0) {
    return __return_storage_ptr__;
  }
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_40,delimiter._M_str,0
                     ,__n);
  if (sVar4 != 0xffffffffffffffff) {
    __pos = 0;
    do {
      if ((ulong)local_40 < __pos) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > __size (which is %zu)",
                           "basic_string_view::substr",__pos);
        pbVar3 = (__return_storage_ptr__->
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar3 != (pointer)0x0) {
          operator_delete(pbVar3,(long)(__return_storage_ptr__->
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pbVar3);
        }
        _Unwind_Resume(uVar5);
      }
      local_50._M_len = sVar4 - __pos;
      if ((long)local_40 - __pos < sVar4 - __pos) {
        local_50._M_len = (long)local_40 - __pos;
      }
      local_50._M_str = (char *)(__pos + str_local._M_len);
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                  ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)__return_storage_ptr__,iVar2,&local_50);
      }
      else {
        (iVar2._M_current)->_M_len = local_50._M_len;
        (iVar2._M_current)->_M_str = local_50._M_str;
        ppbVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      __pos = sVar4 + __n;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_40,
                         delimiter._M_str,__pos,__n);
    } while (sVar4 != 0xffffffffffffffff);
    if (__pos <= (ulong)local_40) goto LAB_0017df01;
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",__pos)
    ;
  }
  __pos = 0;
LAB_0017df01:
  local_50._M_len = (long)local_40 - __pos;
  local_50._M_str = (char *)(__pos + str_local._M_len);
  iVar2._M_current =
       (__return_storage_ptr__->
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (__return_storage_ptr__->
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
              ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)__return_storage_ptr__,iVar2,&local_50);
  }
  else {
    (iVar2._M_current)->_M_len = local_50._M_len;
    (iVar2._M_current)->_M_str = local_50._M_str;
    ppbVar1 = &(__return_storage_ptr__->
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppbVar1 = *ppbVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string_view> split(std::string_view str, std::string_view delimiter) {
        std::vector<std::string_view> tokens;

        if (str.empty()) {
            return tokens;
        }

        size_t from = 0;
        size_t to = str.find(delimiter);

        while (to != std::string_view::npos) {
            tokens.push_back(str.substr(from, to - from));
            from = to + delimiter.length();
            to = str.find(delimiter, from);
        }

        tokens.push_back(str.substr(from, str.size() - from));
        return tokens;
    }